

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_get_rows::build_graph(test_get_rows *this,ggml_context *ctx)

{
  char cVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  
  pgVar2 = test_case::ggml_new_tensor_3d
                     (&this->super_test_case,ctx,this->type,(long)this->n,(long)this->m,
                      (long)this->b);
  ggml_set_name(pgVar2,"in");
  pgVar3 = test_case::ggml_new_tensor_2d
                     (&this->super_test_case,ctx,GGML_TYPE_I32,(long)this->r,(long)this->b);
  ggml_set_name(pgVar3,"rows");
  if (this->v == true) {
    pgVar3 = (ggml_tensor *)
             ggml_view_2d(ctx,pgVar3,(long)(this->r / 2),(long)this->b,pgVar3->nb[1],0);
    ggml_set_name(pgVar3,"view_of_rows");
  }
  cVar1 = ggml_is_matrix(pgVar2);
  if (cVar1 != '\0') {
    cVar1 = ggml_is_vector(pgVar3);
    if (cVar1 != '\0') {
      ggml_set_param(ctx,pgVar2);
    }
  }
  pgVar2 = (ggml_tensor *)ggml_get_rows(ctx,pgVar2,pgVar3);
  ggml_set_name(pgVar2,"out");
  return pgVar2;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * in = ggml_new_tensor_3d(ctx, type, n, m, b);
        ggml_set_name(in, "in");

        ggml_tensor * rows = ggml_new_tensor_2d(ctx, GGML_TYPE_I32, r, b);
        ggml_set_name(rows, "rows");
        if (v) {
            rows = ggml_view_2d(ctx, rows, r/2, b, rows->nb[1], 0);
            ggml_set_name(rows, "view_of_rows");
        }

        const bool grad_supported = ggml_is_matrix(in) && ggml_is_vector(rows);
        if (grad_supported) {
            ggml_set_param(ctx, in);
            // rows is a constant input -> no gradients
        }

        ggml_tensor * out = ggml_get_rows(ctx, in, rows);
        ggml_set_name(out, "out");

        return out;
    }